

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<FixStringCacheKey,_QString>_>::Data
          (Data<QHashPrivate::Node<FixStringCacheKey,_QString>_> *this,
          Data<QHashPrivate::Node<FixStringCacheKey,_QString>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  Data *pDVar3;
  ulong uVar4;
  Node<FixStringCacheKey,_QString> *pNVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  R RVar9;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar7 = other->numBuckets;
  sVar8 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar8;
  this->spans = (Span *)0x0;
  RVar9 = allocateSpans(sVar7);
  this->spans = (Span *)RVar9.spans;
  if (RVar9.nSpans != 0) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      pSVar1 = other->spans;
      sVar8 = 0;
      do {
        uVar4 = (ulong)pSVar1->offsets[sVar8 + lVar6];
        if (uVar4 != 0xff) {
          pEVar2 = pSVar1[sVar7].entries;
          pNVar5 = Span<QHashPrivate::Node<FixStringCacheKey,_QString>_>::insert
                             (this->spans + sVar7,sVar8);
          (pNVar5->key).hash = *(size_t *)pEVar2[uVar4].storage.data;
          pDVar3 = *(Data **)(pEVar2[uVar4].storage.data + 8);
          (pNVar5->key).string.d.d = pDVar3;
          (pNVar5->key).string.d.ptr = *(char16_t **)(pEVar2[uVar4].storage.data + 0x10);
          (pNVar5->key).string.d.size = *(qsizetype *)(pEVar2[uVar4].storage.data + 0x18);
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar3 = *(Data **)(pEVar2[uVar4].storage.data + 0x20);
          (pNVar5->key).pwd.d.d = pDVar3;
          (pNVar5->key).pwd.d.ptr = *(char16_t **)(pEVar2[uVar4].storage.data + 0x28);
          (pNVar5->key).pwd.d.size = *(qsizetype *)(pEVar2[uVar4].storage.data + 0x30);
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          (pNVar5->key).flags = pEVar2[uVar4].storage.data[0x38];
          pDVar3 = *(Data **)(pEVar2[uVar4].storage.data + 0x40);
          (pNVar5->value).d.d = pDVar3;
          (pNVar5->value).d.ptr = *(char16_t **)(pEVar2[uVar4].storage.data + 0x48);
          (pNVar5->value).d.size = *(qsizetype *)(pEVar2[uVar4].storage.data + 0x50);
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != 0x80);
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (sVar7 != RVar9.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }